

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

double hermite_integral(int n)

{
  double dVar1;
  double dVar2;
  
  if (n < 0) {
    dVar1 = r8_huge();
    dVar1 = -dVar1;
  }
  else {
    dVar1 = 0.0;
    if ((n & 1U) == 0) {
      dVar2 = r8_factorial2(n + -1);
      dVar1 = exp2((double)((uint)n >> 1));
      dVar1 = (dVar2 * 1.7724538509055159) / dVar1;
    }
  }
  return dVar1;
}

Assistant:

double hermite_integral ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_INTEGRAL evaluates a monomial Hermite integral.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -oo < x < +oo ) x^n exp(-x^2) dx
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 February 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the integral.  
//    0 <= N.
//
//    Output, double VALUE, the value of the integral.
//
{
  const double r8_pi = 3.141592653589793;
  double value;

  if ( n < 0 )
  {
    value = - r8_huge ( );
  }
  else if ( ( n % 2 ) == 1 )
  {
    value = 0.0;
  }
  else
  {
    value = r8_factorial2 ( n - 1 ) * sqrt ( r8_pi ) / pow ( 2.0, n / 2 );
  }

  return value;
}